

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter_tests.c
# Opt level: O2

void text_reporter_tests_setup(void)

{
  int iVar1;
  
  reporter = (TestReporter *)create_text_reporter();
  iVar1 = start_cgreen_messaging(0x29a);
  reporter->ipc = iVar1;
  clear_output();
  set_text_reporter_printer(reporter,mocked_printer);
  set_text_reporter_vprinter(reporter,mocked_vprinter);
  return;
}

Assistant:

static void text_reporter_tests_setup(void) {
    reporter = create_text_reporter();

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(666);

    clear_output();
    set_text_reporter_printer(reporter, mocked_printer);
    set_text_reporter_vprinter(reporter, mocked_vprinter);
}